

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_98(QPDF *pdf,char *arg2)

{
  __type_conflict1 _Var1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  QPDFObjectHandle oh;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  Pl_Buffer bf2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98 [6];
  Pl_Buffer bf1;
  
  iVar3 = 1;
  while( true ) {
    iVar4 = (int)pdf;
    if (iVar3 == 7) {
      QPDF::getObject((int)&local_f0,iVar4);
      QPDFObjectHandle::getDict();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&bf1,"/Test",(allocator<char> *)&oh);
      operator____qpdf((char *)&local_c0,0x13e2e8);
      QPDFObjectHandle::replaceKey((string *)&bf2,(QPDFObjectHandle *)&bf1);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_c0._M_string_length);
      std::__cxx11::string::~string((string *)&bf1);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_98);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_f0._M_string_length);
      QPDF::getObject((int)&local_c0,iVar4);
      std::__cxx11::string::string<std::allocator<char>>((string *)&bf2,"",(allocator<char> *)&oh);
      QPDFObjectHandle::getStreamJSON
                ((int)&local_f0,(qpdf_json_stream_data_e)&local_c0,qpdf_dl_specialized,
                 (Pipeline *)0x1,(string *)0x1);
      JSON::unparse_abi_cxx11_();
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &bf1,
                              "{\n  \"data\": \"QlQKICAvRjEgMjQgVGYKICA3MiA3MjAgVGQKICAoUG90YXRvKSBUagpFVAo=\",\n  \"dict\": {\n    \"/Test\": 42\n  }\n}"
                             );
      if (bVar2) {
        std::__cxx11::string::~string((string *)&bf1);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_f0._M_string_length);
        std::__cxx11::string::~string((string *)&bf2);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_c0._M_string_length);
        return;
      }
      __assert_fail("pdf.getObject(4, 0) .getStreamJSON(JSON::LATEST, qpdf_sj_inline, qpdf_dl_generalized, nullptr, \"\") .unparse() == \"{\\n\" \"  \\\"data\\\": \\\"QlQKICAvRjEgMjQgVGYKICA3MiA3MjAgVGQKICAoUG90YXRvKSBUagpFVAo=\\\",\\n\" \"  \\\"dict\\\": {\\n\" \"    \\\"/Test\\\": 42\\n\" \"  }\\n\" \"}\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                    ,0xd90,"void test_98(QPDF &, const char *)");
    }
    iVar5 = (int)&oh;
    QPDF::getObject(iVar5,iVar4);
    Pl_Buffer::Pl_Buffer(&bf1,"write",(Pipeline *)0x0);
    Pl_Buffer::Pl_Buffer(&bf2,"get",(Pipeline *)0x0);
    QPDFObjectHandle::writeJSON(iVar5,(Pipeline *)0x2,SUB81(&bf1,0),1);
    Pl_Buffer::finish();
    QPDFObjectHandle::getJSON((int)&local_f0,SUB81(&oh,0));
    JSON::write((Pipeline *)&local_f0,(ulong)&bf2);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_f0._M_string_length);
    Pl_Buffer::finish();
    Pl_Buffer::getString_abi_cxx11_();
    Pl_Buffer::getString_abi_cxx11_();
    _Var1 = std::operator==(&local_f0,&local_c0);
    if (!_Var1) break;
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_f0);
    Pl_Buffer::~Pl_Buffer(&bf2);
    Pl_Buffer::~Pl_Buffer(&bf1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&oh.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    iVar3 = iVar3 + 1;
  }
  __assert_fail("bf1.getString() == bf2.getString()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                ,0xd82,"void test_98(QPDF &, const char *)");
}

Assistant:

static void
test_98(QPDF& pdf, char const* arg2)
{
    // Test methods no longer used by qpdf as a result of QPDFObjectHandle::writeJSON. This test is
    // built for minimal.pdf.

    // Test QPDFObjectHandle::getJSON.
    for (int i = 1; i < 7; ++i) {
        auto oh = pdf.getObject(i, 0);
        Pl_Buffer bf1{"write", nullptr};
        Pl_Buffer bf2{"get", nullptr};
        oh.writeJSON(JSON::LATEST, &bf1, true, 7);
        bf1.finish();
        oh.getJSON(JSON::LATEST, true).write(&bf2, 7);
        bf2.finish();
        assert(bf1.getString() == bf2.getString());
    }

    // Test QPDFObjectHandle::getStreamJSON.
    pdf.getObject(4, 0).getDict().replaceKey("/Test", "42"_qpdf);
    assert(
        pdf.getObject(4, 0)
            .getStreamJSON(JSON::LATEST, qpdf_sj_inline, qpdf_dl_generalized, nullptr, "")
            .unparse() ==
        "{\n"
        "  \"data\": \"QlQKICAvRjEgMjQgVGYKICA3MiA3MjAgVGQKICAoUG90YXRvKSBUagpFVAo=\",\n"
        "  \"dict\": {\n"
        "    \"/Test\": 42\n"
        "  }\n"
        "}");
}